

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

bool __thiscall
Js::SourceTextModuleRecord::ResolveExport
          (SourceTextModuleRecord *this,PropertyId exportName,ResolveSet *resolveSet,
          ModuleNameRecord **exportRecord)

{
  code *pcVar1;
  anon_class_24_3_b326b697 fn;
  anon_class_32_4_e3f87347 fn_00;
  anon_class_40_5_c00093b8 fn_01;
  anon_class_40_5_e849715b fn_02;
  ModuleNameRecord **this_00;
  bool bVar2;
  ScriptContext *this_01;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar5;
  SList<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *this_02;
  undefined4 *puVar6;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> **ppSVar7;
  SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *pSVar8;
  ModuleRecordBase **ppMVar9;
  ModuleNameRecord *local_160;
  ModuleNameRecord *starResolution;
  SourceTextModuleRecord *pSStack_150;
  bool ambiguousResolution;
  long lStack_148;
  ArenaAllocator **local_140;
  byte *pbStack_138;
  ResolveSet **local_130;
  byte local_121;
  undefined1 local_120 [7];
  bool isAmbiguous;
  ModuleNameRecord *local_110;
  ModuleNameRecord *importRecord;
  ModuleRecordBase *sourceModule;
  long local_f8;
  PropertyId *local_f0;
  PropertyId local_e4;
  undefined1 local_e0 [4];
  PropertyId localNameId;
  SourceTextModuleRecord *local_d0;
  long local_c8;
  ArenaAllocator **local_c0;
  bool *local_b8;
  bool local_a9;
  code *pcStack_a8;
  bool hasCircularRef;
  undefined8 local_a0;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_38;
  ArenaAllocator *allocator;
  ModuleNameRecord **exportRecord_local;
  ResolveSet *resolveSet_local;
  SourceTextModuleRecord *pSStack_18;
  PropertyId exportName_local;
  SourceTextModuleRecord *this_local;
  
  allocator = (ArenaAllocator *)exportRecord;
  exportRecord_local = (ModuleNameRecord **)resolveSet;
  resolveSet_local._4_4_ = exportName;
  pSStack_18 = this;
  this_01 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
  local_38 = &ScriptContext::GeneralAllocator(this_01)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  ppBVar3 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                      ((WriteBarrierPtr *)&this->resolvedExportMap);
  pAVar4 = local_38;
  if (*ppBVar3 ==
      (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,
               (type_info *)
               &JsUtil::
                BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
               ,0x244);
    pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar4,&local_60);
    local_70 = Memory::ArenaAllocator::Alloc;
    local_68 = 0;
    pBVar5 = (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar4,0x3f67b0);
    JsUtil::
    BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(pBVar5,(AllocatorType *)local_38,0);
    Memory::
    WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::operator=(&this->resolvedExportMap,pBVar5);
  }
  pBVar5 = Memory::
           WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::operator->(&this->resolvedExportMap);
  bVar2 = JsUtil::
          BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>
                    (pBVar5,(int *)((long)&resolveSet_local + 4),(ModuleNameRecord **)allocator);
  pAVar4 = local_38;
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    if (exportRecord_local == (ModuleNameRecord **)0x0) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_98,
                 (type_info *)
                 &SList<Js::ModuleNameRecord,Memory::ArenaAllocator,RealCount>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                 ,0x24d);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_98);
      pcStack_a8 = Memory::ArenaAllocator::Alloc;
      local_a0 = 0;
      this_02 = (SList<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
                new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)pAVar4,0x3f67b0);
      SList<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>::SList
                (this_02,(ArenaAllocator *)local_38);
      exportRecord_local = (ModuleNameRecord **)this_02;
    }
    (allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
    super_Allocator.outOfMemoryFunc = (_func_void *)0x0;
    local_a9 = false;
    local_c8 = (long)&resolveSet_local + 4;
    local_c0 = &allocator;
    local_b8 = &local_a9;
    fn_00.exportName = (PropertyId *)local_c8;
    fn_00.this = this;
    fn_00.exportRecord = (ModuleNameRecord ***)local_c0;
    fn_00.hasCircularRef = local_b8;
    local_d0 = this;
    SListBase<Js::ModuleNameRecord,Memory::ArenaAllocator,RealCount>::
    MapUntil<Js::SourceTextModuleRecord::ResolveExport(int,SList<Js::ModuleNameRecord,Memory::ArenaAllocator,RealCount>*,Js::ModuleNameRecord**)::__0>
              ((SListBase<Js::ModuleNameRecord,Memory::ArenaAllocator,RealCount> *)
               exportRecord_local,fn_00);
    this_00 = exportRecord_local;
    if ((local_a9 & 1U) == 0) {
      ModuleNameRecord::ModuleNameRecord
                ((ModuleNameRecord *)local_e0,&this->super_ModuleRecordBase,resolveSet_local._4_4_);
      SList<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>::Prepend
                ((SList<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)this_00,
                 (ModuleNameRecord *)local_e0);
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                          ((WriteBarrierPtr *)&this->localExportRecordList);
      if (*ppSVar7 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        local_e4 = -1;
        pSVar8 = Memory::
                 WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>
                 ::operator->(&this->localExportRecordList);
        local_f8 = (long)&resolveSet_local + 4;
        local_f0 = &local_e4;
        fn.exportName = (PropertyId *)local_f8;
        fn.this = this;
        fn.localNameId = local_f0;
        sourceModule = &this->super_ModuleRecordBase;
        SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount>::
        MapUntil<Js::SourceTextModuleRecord::ResolveExport(int,SList<Js::ModuleNameRecord,Memory::ArenaAllocator,RealCount>*,Js::ModuleNameRecord**)::__1>
                  ((SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount> *)pSVar8,
                   fn);
        if (local_e4 != -1) {
          local_110 = (ModuleNameRecord *)0x0;
          importRecord = (ModuleNameRecord *)this;
          ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                              ((WriteBarrierPtr *)&this->importRecordList);
          if (((*ppSVar7 !=
                (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
              (bVar2 = ResolveImport(this,local_e4,&local_110), bVar2)) &&
             (local_110 != (ModuleNameRecord *)0x0)) {
            ppMVar9 = Memory::WriteBarrierPtr::operator_cast_to_ModuleRecordBase__
                                ((WriteBarrierPtr *)local_110);
            importRecord = (ModuleNameRecord *)*ppMVar9;
            local_e4 = local_110->bindingName;
          }
          pBVar5 = Memory::
                   WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   ::operator->(&this->resolvedExportMap);
          ModuleNameRecord::ModuleNameRecord
                    ((ModuleNameRecord *)local_120,(ModuleRecordBase *)importRecord,local_e4);
          JsUtil::
          BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::AddNew(pBVar5,(int *)((long)&resolveSet_local + 4),(ModuleNameRecord *)local_120);
          pBVar5 = Memory::
                   WriteBarrierPtr<JsUtil::BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   ::operator->(&this->resolvedExportMap);
          JsUtil::
          BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>
                    (pBVar5,(int *)((long)&resolveSet_local + 4),(ModuleNameRecord **)allocator);
          return true;
        }
      }
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                          ((WriteBarrierPtr *)&this->indirectExportRecordList);
      if (*ppSVar7 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        local_121 = 0;
        pSVar8 = Memory::
                 WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>
                 ::operator->(&this->indirectExportRecordList);
        lStack_148 = (long)&resolveSet_local + 4;
        local_140 = &allocator;
        pbStack_138 = &local_121;
        local_130 = (ResolveSet **)&exportRecord_local;
        fn_01.exportName = (PropertyId *)lStack_148;
        fn_01.this = this;
        fn_01.exportRecord = (ModuleNameRecord ***)local_140;
        fn_01.isAmbiguous = (bool *)pbStack_138;
        fn_01.resolveSet = local_130;
        pSStack_150 = this;
        SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount>::
        MapUntil<Js::SourceTextModuleRecord::ResolveExport(int,SList<Js::ModuleNameRecord,Memory::ArenaAllocator,RealCount>*,Js::ModuleNameRecord**)::__2>
                  ((SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount> *)pSVar8,
                   fn_01);
        if ((local_121 & 1) != 0) {
          return false;
        }
        if ((allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
            super_Allocator.outOfMemoryFunc != (_func_void *)0x0) {
          return true;
        }
      }
      if (resolveSet_local._4_4_ == 0x6e) {
        this_local._7_1_ = false;
      }
      else {
        starResolution._7_1_ = 0;
        ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SList__
                            ((WriteBarrierPtr *)&this->starExportRecordList);
        if (*ppSVar7 != (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0)
        {
          local_160 = (ModuleNameRecord *)0x0;
          pSVar8 = Memory::
                   WriteBarrierPtr<SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>_>
                   ::operator->(&this->starExportRecordList);
          fn_02.exportName = (PropertyId *)((long)&resolveSet_local + 4);
          fn_02.this = this;
          fn_02.resolveSet = (ResolveSet **)&exportRecord_local;
          fn_02.ambiguousResolution = (bool *)((long)&starResolution + 7);
          fn_02.starResolution = &local_160;
          SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount>::
          MapUntil<Js::SourceTextModuleRecord::ResolveExport(int,SList<Js::ModuleNameRecord,Memory::ArenaAllocator,RealCount>*,Js::ModuleNameRecord**)::__3>
                    ((SListBase<ModuleImportOrExportEntry,Memory::ArenaAllocator,RealCount> *)pSVar8
                     ,fn_02);
          if ((starResolution._7_1_ & 1) == 0) {
            (allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
            super_Allocator.outOfMemoryFunc = (_func_void *)local_160;
          }
        }
        this_local._7_1_ = (bool)((starResolution._7_1_ ^ 0xff) & 1);
      }
    }
    else {
      if ((allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).
          super_Allocator.outOfMemoryFunc != (_func_void *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                    ,0x25d,"(*exportRecord == nullptr)","*exportRecord == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SourceTextModuleRecord::ResolveExport(PropertyId exportName, ResolveSet* resolveSet, ModuleNameRecord** exportRecord)
    {
        ArenaAllocator* allocator = scriptContext->GeneralAllocator();
        if (resolvedExportMap == nullptr)
        {
            resolvedExportMap = Anew(allocator, ResolvedExportMap, allocator);
        }
        if (resolvedExportMap->TryGetReference(exportName, exportRecord))
        {
            return true;
        }
        // TODO: use per-call/loop allocator?
        if (resolveSet == nullptr)
        {
            resolveSet = Anew(allocator, ResolveSet, allocator);
        }

        *exportRecord = nullptr;
        bool hasCircularRef = false;
        resolveSet->MapUntil([&](ModuleNameRecord moduleNameRecord) {
            if (moduleNameRecord.module == this && moduleNameRecord.bindingName == exportName)
            {
                *exportRecord = nullptr;
                hasCircularRef = true;
                return true;
            }
            return false;
        });
        if (hasCircularRef)
        {
            Assert(*exportRecord == nullptr);
            return true;
        }
        resolveSet->Prepend(ModuleNameRecord(this, exportName));

        if (localExportRecordList != nullptr)
        {
            PropertyId localNameId = Js::Constants::NoProperty;
            localExportRecordList->MapUntil([&](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                if (exportNameId == exportName)
                {
                    localNameId = EnsurePropertyIdForIdentifier(exportEntry.localName);
                    return true;
                }
                return false;
            });
            if (localNameId != Js::Constants::NoProperty)
            {
                // Check to see if we are exporting something we imported from another module without using a re-export.
                // ex: import { foo } from 'module'; export { foo };
                ModuleRecordBase* sourceModule = this;
                ModuleNameRecord* importRecord = nullptr;
                if (this->importRecordList != nullptr
                    && this->ResolveImport(localNameId, &importRecord)
                    && importRecord != nullptr)
                {
                    sourceModule = importRecord->module;
                    localNameId = importRecord->bindingName;
                }
                resolvedExportMap->AddNew(exportName, { sourceModule, localNameId });
                // return the address from Map buffer.
                resolvedExportMap->TryGetReference(exportName, exportRecord);
                return true;
            }
        }

        if (indirectExportRecordList != nullptr)
        {
            bool isAmbiguous = false;
            indirectExportRecordList->MapUntil([&](ModuleImportOrExportEntry exportEntry) {
                PropertyId reexportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                if (exportName != reexportNameId)
                {
                    return false;
                }

                PropertyId importNameId = EnsurePropertyIdForIdentifier(exportEntry.importName);
                SourceTextModuleRecord* childModuleRecord = GetChildModuleRecord(exportEntry.moduleRequest->Psz());
                if (childModuleRecord == nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_CannotResolveModule, exportEntry.moduleRequest->Psz());
                }

                if (exportEntry.importName->GetPropertyId() == PropertyIds::star_)
                {
                    // export * as someName from "foo"
                    *exportRecord = childModuleRecord->GetNamespaceNameRecord();
                    return true;
                }

                isAmbiguous = !childModuleRecord->ResolveExport(importNameId, resolveSet, exportRecord);
                if (isAmbiguous)
                {
                    // ambiguous; don't need to search further
                    return true;
                }

                // found a resolution. done;
                if (*exportRecord != nullptr)
                {
                    return true;
                }
                return false;
            });
            if (isAmbiguous)
            {
                return false;
            }
            if (*exportRecord != nullptr)
            {
                return true;
            }
        }

        if (exportName == PropertyIds::default_)
        {
            return false;
        }

        bool ambiguousResolution = false;
        if (this->starExportRecordList != nullptr)
        {
            ModuleNameRecord* starResolution = nullptr;
            starExportRecordList->MapUntil([&](ModuleImportOrExportEntry starExportEntry) {
                ModuleNameRecord* currentResolution = nullptr;
                SourceTextModuleRecord* childModule = GetChildModuleRecord(starExportEntry.moduleRequest->Psz());
                if (childModule == nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptError::ThrowReferenceError(GetScriptContext(), JSERR_CannotResolveModule, starExportEntry.moduleRequest->Psz());
                }
                if (childModule->errorObject != nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptExceptionOperators::Throw(childModule->errorObject, GetScriptContext());
                }

                // if ambiguous, return "ambiguous"
                if (!childModule->ResolveExport(exportName, resolveSet, &currentResolution))
                {
                    ambiguousResolution = true;
                    return true;
                }
                if (currentResolution != nullptr)
                {
                    if (starResolution == nullptr)
                    {
                        starResolution = currentResolution;
                    }
                    else
                    {
                        if (currentResolution->bindingName != starResolution->bindingName ||
                            currentResolution->module != starResolution->module)
                        {
                            ambiguousResolution = true;
                        }
                        return true;
                    }
                }
                return false;
            });
            if (!ambiguousResolution)
            {
                *exportRecord = starResolution;
            }
        }
        return !ambiguousResolution;
    }